

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O2

REF_STATUS ref_swap_remove_two_face_cell(REF_GRID ref_grid,REF_INT cell)

{
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  REF_INT *pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  undefined8 uStack_a0;
  uint local_8c;
  uint local_88;
  REF_INT found;
  long local_80;
  uint local_78;
  uint local_74;
  uint local_70;
  int local_6c;
  undefined8 local_68;
  uint local_5c;
  REF_INT face;
  REF_INT face_nodes [4];
  
  ref_cell = ref_grid->cell[8];
  lVar10 = 0;
  local_8c = 0xffffffff;
  local_80 = CONCAT44(local_80._4_4_,0xffffffff);
  local_88 = local_8c;
  local_78 = local_8c;
  local_74 = local_8c;
  local_70 = local_8c;
  local_6c = cell;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    pRVar1 = ref_cell->c2n;
    pRVar2 = ref_cell->f2n;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      *(REF_INT *)((long)&local_68 + lVar5 * 4) =
           pRVar1[(long)ref_cell->size_per * (long)cell +
                  (long)*(int *)((long)pRVar2 + lVar5 * 4 + lVar10)];
    }
    RVar3 = ref_cell_with(ref_grid->cell[3],(REF_INT *)&local_68,&found);
    if (RVar3 == 0) {
      uVar4 = ref_cell_nodes(ref_grid->cell[3],found,face_nodes);
      if (uVar4 != 0) {
        pcVar9 = "tri";
        uStack_a0 = 0x38;
        goto LAB_001ebff8;
      }
      cell = local_6c;
      if ((int)local_80 == -1) {
        local_80 = CONCAT44(local_80._4_4_,found);
        local_8c = face_nodes[3];
        local_78 = (uint)lVar6;
      }
      else {
        if (local_88 != 0xffffffff) {
          pcVar9 = "three or more faces detected";
          uStack_a0 = 0x3f;
          uVar4 = 3;
          goto LAB_001ebff8;
        }
        local_88 = found;
        local_70 = face_nodes[3];
        local_74 = (uint)lVar6;
      }
    }
    lVar10 = lVar10 + 0x10;
  }
  uVar4 = 3;
  if ((((int)local_80 != -1) && (local_88 != 0xffffffff)) && (local_8c == local_70)) {
    uVar4 = ref_cell_remove(ref_grid->cell[3],(int)local_80);
    if (uVar4 == 0) {
      uVar4 = ref_cell_remove(ref_grid->cell[3],local_88);
      if (uVar4 == 0) {
        uVar8 = (ulong)local_78;
        uVar7 = (ulong)local_74;
        lVar6 = 0;
        for (uVar11 = 0; uVar11 != 4; uVar11 = uVar11 + 1) {
          pRVar1 = ref_cell->c2n;
          pRVar2 = ref_cell->f2n;
          for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
            *(REF_INT *)((long)&local_68 + lVar10 * 4) =
                 pRVar1[(long)ref_cell->size_per * (long)cell +
                        (long)*(int *)((long)pRVar2 + lVar10 * 4 + lVar6)];
          }
          if (uVar11 != uVar7 && uVar11 != uVar8) {
            local_5c = local_8c;
            local_68 = CONCAT44((int)local_68,(int)((ulong)local_68 >> 0x20));
            local_80 = lVar6;
            uVar4 = ref_cell_add(ref_grid->cell[3],(REF_INT *)&local_68,&face);
            lVar6 = local_80;
            if (uVar4 != 0) {
              pcVar9 = "add tri";
              uStack_a0 = 0x57;
              goto LAB_001ebff8;
            }
          }
          lVar6 = lVar6 + 0x10;
        }
        uVar4 = ref_cell_remove(ref_cell,local_6c);
        if (uVar4 == 0) {
          return 0;
        }
        pcVar9 = "remove tet";
        uStack_a0 = 0x5b;
      }
      else {
        pcVar9 = "remove tri1";
        uStack_a0 = 0x4d;
      }
    }
    else {
      pcVar9 = "remove tri0";
      uStack_a0 = 0x4c;
    }
LAB_001ebff8:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
           uStack_a0,"ref_swap_remove_two_face_cell",(ulong)uVar4,pcVar9);
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_swap_remove_two_face_cell(REF_GRID ref_grid,
                                                 REF_INT cell) {
  REF_CELL ref_cell;
  REF_INT cell_face;
  REF_INT node;
  REF_INT cell_nodes[4];
  REF_INT face_nodes[4];
  REF_INT found;
  REF_INT face0, face1;
  REF_INT cell_face0, cell_face1;
  REF_INT faceid0, faceid1;
  REF_INT temp, face;

  ref_cell = ref_grid_tet(ref_grid);

  face0 = REF_EMPTY;
  face1 = REF_EMPTY;
  faceid0 = REF_EMPTY;
  faceid1 = REF_EMPTY;
  cell_face0 = REF_EMPTY;
  cell_face1 = REF_EMPTY;
  for (cell_face = 0; cell_face < 4; cell_face++) {
    for (node = 0; node < 4; node++)
      cell_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
    if (REF_SUCCESS ==
        ref_cell_with(ref_grid_tri(ref_grid), cell_nodes, &found)) {
      RSS(ref_cell_nodes(ref_grid_tri(ref_grid), found, face_nodes), "tri");
      if (REF_EMPTY == face0) {
        face0 = found;
        faceid0 = face_nodes[3];
        cell_face0 = cell_face;
      } else {
        if (REF_EMPTY != face1) {
          RSS(REF_INVALID, "three or more faces detected");
        }
        face1 = found;
        faceid1 = face_nodes[3];
        cell_face1 = cell_face;
      }
    }
  }

  if (REF_EMPTY == face0) return REF_INVALID;
  if (REF_EMPTY == face1) return REF_INVALID;
  if (faceid0 != faceid1) return REF_INVALID;

  RSS(ref_cell_remove(ref_grid_tri(ref_grid), face0), "remove tri0");
  RSS(ref_cell_remove(ref_grid_tri(ref_grid), face1), "remove tri1");

  for (cell_face = 0; cell_face < 4; cell_face++) {
    for (node = 0; node < 4; node++)
      cell_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
    if (cell_face != cell_face0 && cell_face != cell_face1) {
      cell_nodes[3] = faceid0;
      temp = cell_nodes[0];
      cell_nodes[0] = cell_nodes[1];
      cell_nodes[1] = temp;
      RSS(ref_cell_add(ref_grid_tri(ref_grid), cell_nodes, &face), "add tri");
    }
  }

  RSS(ref_cell_remove(ref_cell, cell), "remove tet");

  return REF_SUCCESS;
}